

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day23.cpp
# Opt level: O1

int64_t __thiscall anon_unknown.dwarf_a4758::Region::solve_distance(Region *this)

{
  long lVar1;
  long __tmp;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t candidates;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  long lVar12;
  ulong uStack_50;
  array<std::pair<long,_long>,_4UL> H;
  
  lVar12 = (this->R)._M_elems[3].second;
  H._M_elems[0].first = (this->R)._M_elems[0].first;
  H._M_elems[0].second = (this->R)._M_elems[0].second;
  H._M_elems[1].first = (this->R)._M_elems[1].first;
  H._M_elems[1].second = (this->R)._M_elems[1].second;
  H._M_elems[2].first = (this->R)._M_elems[2].first;
  H._M_elems[2].second = (this->R)._M_elems[2].second;
  H._M_elems[3].first = (this->R)._M_elems[3].first;
  lVar1 = 8;
  do {
    uVar4 = *(ulong *)((long)&uStack_50 + lVar1);
    uVar7 = *(ulong *)((long)&H._M_elems[0].first + lVar1);
    uVar3 = -uVar7;
    if (0 < (long)uVar7) {
      uVar3 = uVar7;
    }
    uVar5 = -uVar4;
    if (0 < (long)uVar4) {
      uVar5 = uVar4;
    }
    if (uVar3 < uVar5) {
      *(ulong *)((long)&uStack_50 + lVar1) = uVar7;
      *(ulong *)((long)&H._M_elems[0].first + lVar1) = uVar4;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x38);
  lVar1 = H._M_elems[1].first + H._M_elems[0].first + H._M_elems[2].first;
  uVar4 = H._M_elems[3].first - lVar1;
  if (uVar4 == 0 || H._M_elems[3].first < lVar1) {
    uVar4 = lVar12 - lVar1;
    if (lVar12 < lVar1) {
      H._M_elems[3].first = lVar12;
    }
    else {
      H._M_elems[3].first = lVar1;
      uVar4 = 0;
    }
  }
  vpmovsxbd_avx(ZEXT416(0x30201000));
  auVar11 = vpgatherdq_avx512vl(*(undefined4 *)((long)&H * 2));
  auVar11 = vpabsq_avx512vl(auVar11);
  auVar9 = vpmaxsq_avx512vl(auVar11._0_16_,auVar11._16_16_);
  auVar10 = vpshufd_avx(auVar9,0xee);
  auVar10 = vpmaxsq_avx512vl(auVar9,auVar10);
  lVar12 = auVar10._0_8_;
  do {
    if (uVar4 == 0) {
      return lVar12;
    }
    lVar1 = -lVar12;
    lVar2 = 0;
    lVar6 = 0;
    do {
      lVar8 = *(long *)((long)&H._M_elems[0].second + lVar2);
      if ((long)uVar4 < 1) {
        if (lVar8 < 0) {
          if (lVar8 == lVar1 || SBORROW8(lVar8,lVar1) != lVar8 + lVar12 < 0) {
            lVar8 = lVar1;
          }
          uVar7 = lVar8 - *(long *)((long)&H._M_elems[0].first + lVar2);
          if ((long)uVar7 <= (long)uVar4) {
            uVar7 = uVar4;
          }
          goto LAB_001127fa;
        }
      }
      else if (0 < lVar8) {
        if (lVar12 <= lVar8) {
          lVar8 = lVar12;
        }
        uVar7 = lVar8 - *(long *)((long)&H._M_elems[0].first + lVar2);
        if ((long)uVar4 < (long)uVar7) {
          uVar7 = uVar4;
        }
LAB_001127fa:
        uVar4 = uVar4 - uVar7;
        lVar8 = uVar7 + *(long *)((long)&H._M_elems[0].first + lVar2);
        *(long *)((long)&H._M_elems[0].first + lVar2) = lVar8;
        lVar6 = lVar6 + (ulong)(lVar8 != *(long *)((long)&H._M_elems[0].second + lVar2));
      }
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x30);
    if (uVar4 != 0) {
      if (lVar6 == 0) {
        return 0x7fffffffffffffff;
      }
      uVar7 = -uVar4;
      if (0 < (long)uVar4) {
        uVar7 = uVar4;
      }
      lVar12 = lVar12 + ((long)(lVar6 + -1 + (uVar7 >> 1)) / lVar6) * 2;
    }
  } while( true );
}

Assistant:

int64_t solve_distance() const {
		auto H = R;

		// Put ranges R[0..2] in absolute value order
		for (int i = 0; i < 3; i++) {
			auto& r = H[i];
			if (labs(r.second) < labs(r.first)) {
				std::swap(r.first, r.second);
			}
		}

		// Get initial value for the sum (N0 + N1 + N2)
		auto sum = H[0].first + H[1].first + H[2].first;
		int64_t delta = 0;
		if (sum < H[3].first) {
			delta = H[3].first - sum;  // Too low
		} else if (sum > H[3].second) {
			delta = H[3].second - sum; // Too high
			H[3].first = H[3].second;
		} else {
			H[3].first = sum;          // Just right
		}

		// Get initial distance to origin
		int64_t dist = 0;
		for (auto&& r : H) {
			dist = std::max(dist, labs(r.first));
		}

		while (delta) {
			int64_t candidates = 0;
			for (int i = 0; i < 3; i++) {
				// Adjust H[0..2] as far as possible without affecting
				// distance to origin
				int64_t step = 0;
				if (delta > 0) {
					if (H[i].second <= 0) continue; // wrong direction
					auto slack = std::min( dist, H[i].second) - H[i].first;
					step = std::min(slack, delta);
				} else {
					if (H[i].second >= 0) continue; // wrong direction
					auto slack = std::max(-dist, H[i].second) - H[i].first;
					step = std::max(slack, delta);
				}
				H[i].first += step;
				delta -= step;
				// Keep track of how many variables still have adjustment room
				if (H[i].first != H[i].second) {
					candidates++;
				}
			}
			if (delta) {
				if (!candidates) {
					// No solution
					return INT64_MAX;
				}
				/* Increase distance-to-origin by the minimum amount which
				 * would satisfy the remaining delta, assuming all candidates
				 * have sufficient slack.  (This may underestimate, in which
				 * case it will loop again with a smaller candidate count.)
				 * Distance must be raised in even increments.
				 */
				dist += (((labs(delta) / 2) + (candidates - 1)) / candidates) * 2;
			}
		}

		return dist;
	}